

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O2

uint32 Clasp::StatisticObject::
       registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>(void)

{
  int iVar1;
  I *unaff_RBX;
  
  if (registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()::vtab_s ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()
                                 ::vtab_s);
    if (iVar1 != 0) {
      registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>::vtab_s.
      super_A.super_I.type.val_ = (Type)Array;
      registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>::vtab_s.
      super_A.size = registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>
                     ::Array_T::size;
      registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>::vtab_s.
      super_A.at = registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>
                   ::Array_T::at;
      __cxa_guard_release(&registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()
                           ::vtab_s);
    }
  }
  if (registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()::id == '\0')
  {
    iVar1 = __cxa_guard_acquire(&registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()
                                 ::id);
    if (iVar1 != 0) {
      registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>::id =
           registerType(unaff_RBX);
      __cxa_guard_release(&registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()
                           ::id);
    }
  }
  return registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>::id;
}

Assistant:

uint32 StatisticObject::registerArray() {
	static const struct Array_T : A {
		Array_T() : A(&Array_T::size, &Array_T::at) {}
		static uint32          size(ObjPtr obj)         { return toU32(static_cast<const T*>(obj)->size()); }
		static StatisticObject at(ObjPtr obj, uint32 i) { return static_cast<const T*>(obj)->at(i); }
	} vtab_s;
	static const uint32 id = registerType(&vtab_s);
	return id;
}